

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O2

void google::protobuf::SplitStringUsing
               (string *full,char *delim,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *result)

{
  char cVar1;
  long lVar2;
  char *pcVar3;
  char c;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  
  cVar1 = *delim;
  local_38 = result;
  if ((cVar1 == '\0') || (delim[1] != '\0')) {
    lVar2 = std::__cxx11::string::find_first_not_of((char *)full,(ulong)delim);
    while (lVar2 != -1) {
      lVar2 = std::__cxx11::string::find_first_of((char *)full,(ulong)delim);
      if (lVar2 == -1) {
        std::__cxx11::string::substr((ulong)&local_58,(ulong)full);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_38,
                   &local_58);
        std::__cxx11::string::~string((string *)&local_58);
        return;
      }
      std::__cxx11::string::substr((ulong)&local_58,(ulong)full);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_38,
                 &local_58);
      std::__cxx11::string::~string((string *)&local_58);
      lVar2 = std::__cxx11::string::find_first_not_of((char *)full,(ulong)delim);
    }
  }
  else {
    pcVar4 = (full->_M_dataplus)._M_p;
    pcVar5 = pcVar4 + full->_M_string_length;
    while (pcVar4 != pcVar5) {
      pcVar3 = pcVar4;
      if (*pcVar4 == cVar1) {
        pcVar4 = pcVar4 + 1;
      }
      else {
        do {
          pcVar3 = pcVar3 + 1;
          pcVar6 = pcVar5;
          if (pcVar3 == pcVar5) break;
          pcVar6 = pcVar3;
        } while (*pcVar3 != cVar1);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar4,pcVar6);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_38,
                   &local_58);
        std::__cxx11::string::~string((string *)&local_58);
        pcVar4 = pcVar6;
      }
    }
  }
  return;
}

Assistant:

void SplitStringUsing(const string& full,
                      const char* delim,
                      std::vector<string>* result) {
  std::back_insert_iterator< std::vector<string> > it(*result);
  SplitStringToIteratorUsing(full, delim, it);
}